

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O2

void * hash_table_enter_bkey(hash_table_t *h,char *key,size_t len,void *val)

{
  uint32 hash;
  char *key_00;
  void *pvVar1;
  
  key_00 = makekey((uint8 *)key,len,(char *)len);
  hash = key2hash(h,key_00);
  ckd_free(key_00);
  pvVar1 = enter(h,hash,key,len,val,0);
  return pvVar1;
}

Assistant:

void *
hash_table_enter_bkey(hash_table_t * h, const char *key, size_t len, void *val)
{
    uint32 hash;
    char *str;

    str = makekey((uint8 *) key, len, NULL);
    hash = key2hash(h, str);
    ckd_free(str);

    return (enter(h, hash, key, len, val, 0));
}